

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void direct_partition_merging
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  CANDIDATE_MV *pCVar1;
  CANDIDATE_MV *pCVar2;
  char cVar3;
  MOTION_MODE MVar4;
  PARTITION_TYPE PVar5;
  byte bVar6;
  byte bVar7;
  uint8_t uVar8;
  byte bVar9;
  ushort uVar10;
  int iVar11;
  uint32_t uVar12;
  MB_MODE_INFO *pMVar13;
  MB_MODE_INFO *pMVar14;
  MB_MODE_INFO *pMVar15;
  MB_MODE_INFO *pMVar16;
  MB_MODE_INFO_EXT_FRAME *pMVar17;
  CANDIDATE_MV CVar18;
  CANDIDATE_MV CVar19;
  CANDIDATE_MV CVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  ThreadData_conflict *pTVar25;
  MACROBLOCKD *pMVar26;
  bool bVar27;
  BLOCK_SIZE BVar28;
  RefCntBuffer *pRVar29;
  byte bVar30;
  MB_MODE_INFO **ppMVar31;
  ulong uVar32;
  YV12_BUFFER_CONFIG *src;
  ushort uVar33;
  uint uVar34;
  uint __c;
  ulong uVar35;
  BLOCK_SIZE BVar36;
  scale_factors *psVar37;
  TXFM_CONTEXT *__s;
  ushort uVar38;
  undefined4 in_register_00000084;
  ulong uVar39;
  undefined4 in_register_0000008c;
  long lVar40;
  int iVar41;
  int iVar42;
  undefined4 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  byte bVar48;
  _Bool use_scaled_ref;
  uint local_6a4;
  MB_MODE_INFO **local_6a0;
  ThreadData_conflict *local_698;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 local_680;
  MACROBLOCKD *local_678;
  TileDataEnc *local_670;
  AV1_COMMON *local_668;
  ulong local_660;
  int_mv frame_mv [25] [8];
  buf_2d yv12_mb [8] [3];
  
  local_688 = CONCAT44(in_register_0000008c,mi_col);
  local_680 = CONCAT44(in_register_00000084,mi_row);
  uVar39 = (ulong)bsize;
  bVar48 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar39];
  local_660 = (ulong)bVar48;
  uVar35 = (ulong)(bVar48 >> 1);
  if (uVar39 < 3) {
    bVar30 = 0;
LAB_001ec141:
    BVar28 = BLOCK_INVALID;
    uVar32 = uVar39;
    switch(uVar39) {
    case 0:
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001ec15b_caseD_1;
    case 3:
      uVar32 = 1;
      break;
    case 6:
      uVar32 = 2;
      break;
    case 9:
      uVar32 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar32 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_001ec15b_caseD_1;
        uVar32 = 5;
      }
    }
    BVar28 = subsize_lookup[bVar30][uVar32];
  }
  else {
    iVar11 = (cpi->common).mi_params.mi_rows;
    BVar28 = BLOCK_INVALID;
    if ((mi_row < iVar11) && (iVar41 = (cpi->common).mi_params.mi_cols, mi_col < iVar41)) {
      iVar42 = (cpi->common).mi_params.mi_stride;
      ppMVar31 = (cpi->common).mi_params.mi_grid_base;
      lVar40 = (long)(iVar42 * mi_row + mi_col);
      BVar36 = ppMVar31[lVar40]->bsize;
      if (BVar36 == bsize) {
        bVar30 = 0;
        local_6a0 = mib;
      }
      else {
        bVar9 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar39]
        ;
        bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar36]
        ;
        bVar7 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar36]
        ;
        if ((bsize != BLOCK_8X8) && ((int)((uint)(bVar48 >> 1) + mi_row) < iVar11)) {
          if ((int)((uint)(bVar9 >> 1) + mi_col) < iVar41) {
            if (bVar7 == bVar48) {
              bVar30 = 8;
              local_6a0 = mib;
              if ((uint)bVar6 << 2 != (uint)bVar9) {
                bVar30 = (ppMVar31[lVar40 + (int)((uint)(bVar9 >> 1) * iVar42)]->bsize != BVar36) *
                         '\x04' + 1;
              }
            }
            else if (bVar6 == bVar9) {
              bVar30 = 9;
              local_6a0 = mib;
              if ((uint)bVar7 << 2 != (uint)bVar48) {
                bVar30 = (ppMVar31[lVar40 + uVar35]->bsize != BVar36) * '\x05' + 2;
              }
            }
            else {
              bVar30 = 3;
              local_6a0 = mib;
              if (((uint)bVar6 * 2 == (uint)bVar9 && (uint)bVar7 * 2 == (uint)bVar48) &&
                 (bVar30 = 4,
                 "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [ppMVar31[lVar40 + (int)((uint)(bVar9 >> 1) * iVar42)]->bsize] != bVar48)) {
                bVar30 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [ppMVar31[lVar40 + uVar35]->bsize] == bVar9) * '\x03' + 3;
              }
            }
            goto LAB_001ec141;
          }
        }
        lVar40 = (ulong)(bVar6 < bVar9) + (ulong)(bVar7 < bVar48) * 2;
        local_6a0 = mib;
        if (lVar40 == 0) goto switchD_001ec15b_caseD_1;
        bVar30 = *(byte *)((long)&get_partition_base_partitions + lVar40);
      }
      goto LAB_001ec141;
    }
  }
switchD_001ec15b_caseD_1:
  pMVar13 = *mib;
  BVar36 = pMVar13->bsize;
  if (BVar36 < BVar28) {
    return;
  }
  pMVar14 = mib[uVar35];
  if (pMVar14->bsize < BVar28) {
    return;
  }
  pMVar15 = mib[(long)(cpi->common).mi_params.mi_stride * uVar35];
  if (pMVar15->bsize < BVar28) {
    return;
  }
  pMVar16 = (mib + (long)(cpi->common).mi_params.mi_stride * uVar35)[uVar35];
  if (pMVar16->bsize < BVar28) {
    return;
  }
  if (pMVar13->skip_txfm == '\0') {
    return;
  }
  if (pMVar14->skip_txfm == '\0') {
    return;
  }
  if (pMVar15->skip_txfm == '\0') {
    return;
  }
  if (pMVar16->skip_txfm == '\0') {
    return;
  }
  cVar3 = pMVar13->ref_frame[1];
  if (cVar3 != pMVar14->ref_frame[1]) {
    return;
  }
  if (cVar3 != pMVar15->ref_frame[1]) {
    return;
  }
  if (-1 < cVar3) {
    return;
  }
  if (cVar3 != pMVar16->ref_frame[1]) {
    return;
  }
  cVar3 = pMVar13->ref_frame[0];
  if (cVar3 != pMVar14->ref_frame[0]) {
    return;
  }
  if (cVar3 != pMVar15->ref_frame[0]) {
    return;
  }
  if (cVar3 < '\x01') {
    return;
  }
  if (cVar3 != pMVar16->ref_frame[0]) {
    return;
  }
  bVar48 = pMVar13->mode;
  if (bVar48 != pMVar14->mode) {
    return;
  }
  if (bVar48 != pMVar15->mode) {
    return;
  }
  if ((bVar48 & 0xfd) != 0xd) {
    return;
  }
  if (bVar48 != pMVar16->mode) {
    return;
  }
  uVar12 = pMVar13->mv[0].as_int;
  if (uVar12 != pMVar14->mv[0].as_int) {
    return;
  }
  if (uVar12 != pMVar15->mv[0].as_int) {
    return;
  }
  if (uVar12 != pMVar16->mv[0].as_int) {
    return;
  }
  MVar4 = pMVar13->motion_mode;
  if (MVar4 != pMVar14->motion_mode) {
    return;
  }
  if (MVar4 != pMVar15->motion_mode) {
    return;
  }
  if (MVar4 != '\0' || pMVar16->motion_mode != '\0') {
    return;
  }
  uVar12 = (pMVar13->interp_filters).as_int;
  if (uVar12 != (pMVar14->interp_filters).as_int) {
    return;
  }
  if (uVar12 != (pMVar15->interp_filters).as_int) {
    return;
  }
  if (uVar12 != (pMVar16->interp_filters).as_int) {
    return;
  }
  uVar38 = *(ushort *)&pMVar13->field_0xa7 & 7;
  if (uVar38 != (*(ushort *)&pMVar14->field_0xa7 & 7)) {
    return;
  }
  if (uVar38 != (*(ushort *)&pMVar15->field_0xa7 & 7)) {
    return;
  }
  if (uVar38 != (*(ushort *)&pMVar16->field_0xa7 & 7)) {
    return;
  }
  local_668 = &cpi->common;
  local_678 = &(td->mb).e_mbd;
  PVar5 = pMVar13->partition;
  pMVar13->bsize = bsize;
  pMVar13->partition = '\0';
  pMVar13->skip_txfm = '\x01';
  local_6a4 = (uint)bsize;
  local_698 = td;
  local_670 = tile_data;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  cVar3 = (*mib)->ref_frame[0];
  lVar40 = 0x10;
  do {
    *(undefined8 *)((long)&local_668 + lVar40) = 0x8000800080008000;
    *(undefined8 *)((long)frame_mv[-1] + lVar40 + 0x18) = 0x8000800080008000;
    *(undefined8 *)((long)frame_mv[0] + lVar40) = 0x8000800080008000;
    *(undefined8 *)((long)frame_mv[0] + lVar40 + 8) = 0x8000800080008000;
    lVar40 = lVar40 + 0x20;
  } while (lVar40 != 0x330);
  uVar38 = *(ushort *)(local_698->mb).color_sensitivity_sb;
  *(ushort *)(local_698->mb).color_sensitivity = uVar38;
  bVar27 = ((uVar38 & 0xff00) != 0x200 && (char)uVar38 != '\x02') &&
           2 < (local_698->mb).nonrd_prune_ref_frame_search;
  local_6a0 = mib;
  find_predictors(cpi,&local_698->mb,cVar3,frame_mv,yv12_mb,(BLOCK_SIZE)local_6a4,(uint)bVar27,
                  (int)&use_scaled_ref,
                  (_Bool *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
  pTVar25 = local_698;
  uVar38 = *(ushort *)((long)&yv12_mb[-4][0].buf + (long)cVar3 * 4);
  pMVar13 = *local_6a0;
  if ((uVar38 != pMVar13->mv[0].as_mv.row) ||
     (uVar10 = *(ushort *)((long)&yv12_mb[-4][0].buf + (long)cVar3 * 4 + 2),
     uVar10 != pMVar13->mv[0].as_mv.col)) {
    pMVar13->bsize = BVar36;
    pMVar13->partition = PVar5;
    av1_set_offsets_without_segment_id
              (cpi,&local_670->tile_info,&local_698->mb,(int)local_680,(int)local_688,BVar36);
    find_predictors(cpi,&pTVar25->mb,cVar3,frame_mv,yv12_mb,(*local_6a0)->bsize,(uint)bVar27,
                    (int)&use_scaled_ref,
                    (_Bool *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
    return;
  }
  if (((byte)(cVar3 - 1U) < 8) &&
     (iVar11 = (cpi->common).remapped_ref_idx[(int)cVar3 - 1], iVar11 != -1)) {
    psVar37 = (cpi->common).ref_scale_factors + iVar11;
  }
  else {
    psVar37 = (scale_factors *)0x0;
  }
  if ((psVar37->x_scale_fp == 0xffffffff) || (psVar37->y_scale_fp == -1)) {
    local_68c = 0;
  }
  else {
    uVar34 = psVar37->x_scale_fp ^ 0x4000;
    local_68c = CONCAT31((int3)(uVar34 >> 8),psVar37->y_scale_fp != 0x4000 || uVar34 != 0);
  }
  uVar33 = -uVar38;
  if (0 < (short)uVar38) {
    uVar33 = uVar38;
  }
  bVar48 = true;
  if ((uVar33 & 7) == 0) {
    uVar38 = -uVar10;
    if (0 < (short)uVar10) {
      uVar38 = uVar10;
    }
    bVar48 = (uVar38 & 7) != 0;
  }
  if ((uVar33 & 0xf) == 0) {
    uVar38 = -uVar10;
    if (0 < (short)uVar10) {
      uVar38 = uVar10;
    }
    if ((byte)((uVar38 & 0xf) != 0 | (byte)local_68c | bVar48 | cpi->ppi->use_svc != 0) != 1)
    goto LAB_001ec811;
  }
  uVar8 = ((cpi->common).seq_params)->monochrome;
  set_ref_ptrs(local_668,local_678,cVar3,pMVar13->ref_frame[1]);
  pMVar26 = local_678;
  iVar11 = (uint)(uVar8 == '\0') * 2;
  if (((byte)(cVar3 - 1U) < 8) &&
     (lVar40 = (long)(cpi->common).remapped_ref_idx[(int)cVar3 - 1], lVar40 != -1)) {
    pRVar29 = (cpi->common).ref_frame_map[lVar40];
  }
  else {
    pRVar29 = (RefCntBuffer *)0x0;
  }
  src = &pRVar29->buf;
  if (pRVar29 == (RefCntBuffer *)0x0) {
    src = (YV12_BUFFER_CONFIG *)0x0;
  }
  iVar41 = (int)local_680;
  iVar42 = (int)local_688;
  av1_setup_pre_planes
            (local_678,0,src,iVar41,iVar42,(local_698->mb).e_mbd.block_ref_scale_factors[0],
             iVar11 + 1);
  av1_enc_build_inter_predictor
            (local_668,pMVar26,iVar41,iVar42,(BUFFER_SET *)0x0,(BLOCK_SIZE)local_6a4,
             (uint)(byte)((bVar48 | (byte)local_68c | cpi->ppi->use_svc != 0) ^ 1),iVar11);
LAB_001ec811:
  pTVar25 = local_698;
  ppMVar31 = local_6a0;
  pMVar17 = (local_698->mb).mbmi_ext_frame;
  bVar48 = av1_ref_frame_type((*local_6a0)->ref_frame);
  pCVar1 = (pTVar25->mb).mbmi_ext.ref_mv_stack[bVar48];
  CVar18 = pCVar1[1];
  pCVar2 = (pTVar25->mb).mbmi_ext.ref_mv_stack[bVar48] + 2;
  CVar19 = *pCVar2;
  CVar20 = pCVar2[1];
  pMVar17->ref_mv_stack[0] = *pCVar1;
  pMVar17->ref_mv_stack[1] = CVar18;
  pMVar17->ref_mv_stack[2] = CVar19;
  pMVar17->ref_mv_stack[3] = CVar20;
  *&pMVar17->weight = (pTVar25->mb).mbmi_ext.weight[bVar48];
  pMVar17->mode_context = (pTVar25->mb).mbmi_ext.mode_context[bVar48];
  pMVar17->ref_mv_count = (pTVar25->mb).mbmi_ext.ref_mv_count[bVar48];
  uVar21 = *(undefined8 *)(pTVar25->mb).mbmi_ext.global_mvs;
  uVar22 = *(undefined8 *)((pTVar25->mb).mbmi_ext.global_mvs + 2);
  uVar23 = *(undefined8 *)((pTVar25->mb).mbmi_ext.global_mvs + 6);
  *(undefined8 *)(pMVar17->global_mvs + 4) = *(undefined8 *)((pTVar25->mb).mbmi_ext.global_mvs + 4);
  *(undefined8 *)(pMVar17->global_mvs + 6) = uVar23;
  *(undefined8 *)pMVar17->global_mvs = uVar21;
  *(undefined8 *)(pMVar17->global_mvs + 2) = uVar22;
  PVar5 = (*ppMVar31)->partition;
  BVar36 = (BLOCK_SIZE)local_6a4;
  BVar28 = get_partition_subsize(BVar36,PVar5);
  pMVar26 = local_678;
  update_ext_partition_context(local_678,(int)local_680,(int)local_688,BVar28,BVar36,PVar5);
  av1_reset_entropy_context
            (pMVar26,BVar36,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  bVar48 = ""[(pTVar25->mb).txfm_search_params.tx_mode_search_type];
  if (bsize == BLOCK_4X4) {
    if (""[uVar39] < bVar48) {
      bVar48 = ""[uVar39];
    }
  }
  else if (""[""[uVar39]] <= bVar48) {
    bVar48 = ""[uVar39];
  }
  pMVar13 = *local_6a0;
  if ((local_698->mb).e_mbd.lossless[*(ushort *)&pMVar13->field_0xa7 & 7] != 0) {
    bVar48 = 0;
  }
  pMVar13->inter_tx_size[0xf] = bVar48;
  auVar44 = pshuflw(ZEXT216(CONCAT11(bVar48,bVar48)),ZEXT216(CONCAT11(bVar48,bVar48)),0);
  uVar43 = auVar44._0_4_;
  pMVar13->tx_size = (char)uVar43;
  pMVar13->inter_tx_size[0] = (char)((uint)uVar43 >> 8);
  pMVar13->inter_tx_size[1] = (char)((uint)uVar43 >> 0x10);
  pMVar13->inter_tx_size[2] = (char)((uint)uVar43 >> 0x18);
  *(undefined4 *)(pMVar13->inter_tx_size + 3) = uVar43;
  *(undefined4 *)(pMVar13->inter_tx_size + 7) = uVar43;
  *(undefined4 *)(pMVar13->inter_tx_size + 0xb) = uVar43;
  __s = (cpi->common).above_contexts.txfm[(local_670->tile_info).tile_row] + (int)local_688;
  (local_698->mb).e_mbd.above_txfm_context = __s;
  (local_698->mb).e_mbd.left_txfm_context =
       (local_698->mb).e_mbd.left_txfm_context_buffer + ((uint)local_680 & 0x1f);
  pMVar13 = *local_6a0;
  bVar48 = pMVar13->tx_size;
  bVar30 = (local_698->mb).e_mbd.width;
  bVar9 = (local_698->mb).e_mbd.height;
  if (pMVar13->skip_txfm == '\0') {
    uVar34 = (uint)*(byte *)(tx_size_high + bVar48);
    bVar27 = true;
  }
  else if ((pMVar13->field_0xa7 & 0x80) == 0) {
    bVar27 = pMVar13->ref_frame[0] < '\x01';
    if (pMVar13->ref_frame[0] < '\x01') {
      uVar34 = tx_size_high[bVar48];
    }
    else {
      uVar34 = (uint)bVar9 * 4 & 0xff;
    }
  }
  else {
    uVar34 = (uint)bVar9 * 4;
    bVar27 = false;
  }
  if ((ulong)bVar30 != 0) {
    if (bVar27) {
      __c = tx_size_wide[bVar48];
    }
    else {
      __c = (uint)bVar30 * 4 & 0xff;
    }
    memset(__s,__c,(ulong)bVar30);
  }
  if ((ulong)bVar9 != 0) {
    memset((local_698->mb).e_mbd.left_txfm_context,uVar34 & 0xff,(ulong)bVar9);
  }
  auVar24 = _DAT_004cf680;
  auVar44 = _DAT_004cf670;
  iVar11 = (cpi->common).mi_params.mi_stride;
  uVar34 = (int)local_660 + (uint)((int)local_660 == 0);
  lVar40 = (ulong)uVar34 - 1;
  auVar45._8_4_ = (int)lVar40;
  auVar45._0_8_ = lVar40;
  auVar45._12_4_ = (int)((ulong)lVar40 >> 0x20);
  ppMVar31 = local_6a0 + 1;
  uVar35 = 0;
  auVar45 = auVar45 ^ _DAT_004cf680;
  do {
    pMVar13 = *local_6a0;
    uVar39 = 0;
    auVar46 = auVar44;
    do {
      auVar47 = auVar46 ^ auVar24;
      if ((bool)(~(auVar47._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar47._0_4_ ||
                  auVar45._4_4_ < auVar47._4_4_) & 1)) {
        *(MB_MODE_INFO **)((long)ppMVar31 + (uVar39 - 8)) = pMVar13;
      }
      if ((auVar47._12_4_ != auVar45._12_4_ || auVar47._8_4_ <= auVar45._8_4_) &&
          auVar47._12_4_ <= auVar45._12_4_) {
        *(MB_MODE_INFO **)((long)ppMVar31 + uVar39) = pMVar13;
      }
      lVar40 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar40 + 2;
      uVar39 = uVar39 + 0x10;
    } while ((uVar34 * 8 + 8 & 0xff0) != uVar39);
    uVar35 = uVar35 + 1;
    ppMVar31 = ppMVar31 + iVar11;
  } while (uVar35 != uVar34);
  return;
}

Assistant:

static void direct_partition_merging(AV1_COMP *cpi, ThreadData *td,
                                     TileDataEnc *tile_data, MB_MODE_INFO **mib,
                                     int mi_row, int mi_col, BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  MB_MODE_INFO **b0 = mib;
  MB_MODE_INFO **b1 = mib + hbs;
  MB_MODE_INFO **b2 = mib + hbs * mi_params->mi_stride;
  MB_MODE_INFO **b3 = mib + hbs * mi_params->mi_stride + hbs;

  // Check if the following conditions are met. This can be updated
  // later with more support added.
  const int further_split = b0[0]->bsize < subsize || b1[0]->bsize < subsize ||
                            b2[0]->bsize < subsize || b3[0]->bsize < subsize;
  if (further_split) return;

  const int no_skip = !b0[0]->skip_txfm || !b1[0]->skip_txfm ||
                      !b2[0]->skip_txfm || !b3[0]->skip_txfm;
  if (no_skip) return;

  const int compound = (b0[0]->ref_frame[1] != b1[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b2[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b3[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] > NONE_FRAME);
  if (compound) return;

  // Intra modes aren't considered here.
  const int different_ref = (b0[0]->ref_frame[0] != b1[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b2[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b3[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] <= INTRA_FRAME);
  if (different_ref) return;

  const int different_mode =
      (b0[0]->mode != b1[0]->mode || b0[0]->mode != b2[0]->mode ||
       b0[0]->mode != b3[0]->mode);
  if (different_mode) return;

  const int unsupported_mode =
      (b0[0]->mode != NEARESTMV && b0[0]->mode != GLOBALMV);
  if (unsupported_mode) return;

  const int different_mv = (b0[0]->mv[0].as_int != b1[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b2[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b3[0]->mv[0].as_int);
  if (different_mv) return;

  const int unsupported_motion_mode =
      (b0[0]->motion_mode != b1[0]->motion_mode ||
       b0[0]->motion_mode != b2[0]->motion_mode ||
       b0[0]->motion_mode != b3[0]->motion_mode ||
       b0[0]->motion_mode != SIMPLE_TRANSLATION);
  if (unsupported_motion_mode) return;

  const int diffent_filter =
      (b0[0]->interp_filters.as_int != b1[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b2[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b3[0]->interp_filters.as_int);
  if (diffent_filter) return;

  const int different_seg = (b0[0]->segment_id != b1[0]->segment_id ||
                             b0[0]->segment_id != b2[0]->segment_id ||
                             b0[0]->segment_id != b3[0]->segment_id);
  if (different_seg) return;

  // Evaluate the ref_mv.
  MB_MODE_INFO **this_mi = mib;
  BLOCK_SIZE orig_bsize = this_mi[0]->bsize;
  const PARTITION_TYPE orig_partition = this_mi[0]->partition;

  this_mi[0]->bsize = bsize;
  this_mi[0]->partition = PARTITION_NONE;
  this_mi[0]->skip_txfm = 1;

  // TODO(yunqing): functions called below can be optimized by
  // removing unrelated operations.
  av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                     mi_col, bsize);

  const MV_REFERENCE_FRAME ref_frame = this_mi[0]->ref_frame[0];
  int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  int force_skip_low_temp_var = 0;
  int skip_pred_mv = 0;
  bool use_scaled_ref;

  for (int i = 0; i < MB_MODE_COUNT; ++i) {
    for (int j = 0; j < REF_FRAMES; ++j) {
      frame_mv[i][j].as_int = INVALID_MV;
    }
  }
  av1_copy(x->color_sensitivity, x->color_sensitivity_sb);
  skip_pred_mv = (x->nonrd_prune_ref_frame_search > 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] != 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] != 2);

  find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, bsize,
                  force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);

  int continue_merging = 1;
  if (frame_mv[NEARESTMV][ref_frame].as_mv.row != b0[0]->mv[0].as_mv.row ||
      frame_mv[NEARESTMV][ref_frame].as_mv.col != b0[0]->mv[0].as_mv.col)
    continue_merging = 0;

  if (!continue_merging) {
    this_mi[0]->bsize = orig_bsize;
    this_mi[0]->partition = orig_partition;

    // TODO(yunqing): Store the results and restore here instead of
    // calling find_predictors() again.
    av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                       mi_col, this_mi[0]->bsize);
    find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, this_mi[0]->bsize,
                    force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);
  } else {
    struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
    const int is_scaled = av1_is_scaled(sf);
    const int is_y_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 8) ||
                               (abs(this_mi[0]->mv[0].as_mv.col) % 8);
    const int is_uv_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 16) ||
                                (abs(this_mi[0]->mv[0].as_mv.col) % 16);

    if (cpi->ppi->use_svc || is_scaled || is_y_subpel_mv || is_uv_subpel_mv) {
      const int num_planes = av1_num_planes(cm);
      set_ref_ptrs(cm, xd, ref_frame, this_mi[0]->ref_frame[1]);
      const YV12_BUFFER_CONFIG *cfg = get_ref_frame_yv12_buf(cm, ref_frame);
      av1_setup_pre_planes(xd, 0, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[0], num_planes);

      if (!cpi->ppi->use_svc && !is_scaled && !is_y_subpel_mv) {
        assert(is_uv_subpel_mv == 1);
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 1,
                                      num_planes - 1);
      } else {
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      num_planes - 1);
      }
    }

    // Copy out mbmi_ext information.
    MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
    MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame = x->mbmi_ext_frame;
    av1_copy_mbmi_ext_to_mbmi_ext_frame(
        mbmi_ext_frame, mbmi_ext, av1_ref_frame_type(this_mi[0]->ref_frame));

    const BLOCK_SIZE this_subsize =
        get_partition_subsize(bsize, this_mi[0]->partition);
    // Update partition contexts.
    update_ext_partition_context(xd, mi_row, mi_col, this_subsize, bsize,
                                 this_mi[0]->partition);

    const int num_planes = av1_num_planes(cm);
    av1_reset_entropy_context(xd, bsize, num_planes);

    // Note: use x->txfm_search_params.tx_mode_search_type instead of
    // cm->features.tx_mode here.
    TX_SIZE tx_size =
        tx_size_from_tx_mode(bsize, x->txfm_search_params.tx_mode_search_type);
    if (xd->lossless[this_mi[0]->segment_id]) tx_size = TX_4X4;
    this_mi[0]->tx_size = tx_size;
    memset(this_mi[0]->inter_tx_size, this_mi[0]->tx_size,
           sizeof(this_mi[0]->inter_tx_size));

    // Update txfm contexts.
    xd->above_txfm_context =
        cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
    xd->left_txfm_context =
        xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
    set_txfm_ctxs(this_mi[0]->tx_size, xd->width, xd->height,
                  this_mi[0]->skip_txfm && is_inter_block(this_mi[0]), xd);

    // Update mi for this partition block.
    for (int y = 0; y < bs; y++) {
      for (int x_idx = 0; x_idx < bs; x_idx++) {
        this_mi[x_idx + y * mi_params->mi_stride] = this_mi[0];
      }
    }
  }
}